

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTest_setDataObject_Test::testBody(TEST_MockSupportTest_setDataObject_Test *this)

{
  void *pvVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  void *pvVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  SimpleString local_148;
  SimpleString local_138;
  MockNamedValue local_128;
  undefined1 local_d8 [128];
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  void *local_18;
  void *ptr;
  TEST_MockSupportTest_setDataObject_Test *this_local;
  
  local_18 = (void *)0x1;
  ptr = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"data");
  SimpleString::SimpleString(&local_58,"type");
  MockSupport::setDataObject(pMVar2,local_48,&local_58,local_18);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar3 = UtestShell::getCurrent();
  pvVar1 = local_18;
  SimpleString::SimpleString((SimpleString *)(local_d8 + 0x20),"");
  pMVar2 = mock((SimpleString *)(local_d8 + 0x20),(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_d8 + 0x10),"data");
  MockSupport::getData((MockNamedValue *)(local_d8 + 0x30),pMVar2,(SimpleString *)(local_d8 + 0x10))
  ;
  pvVar4 = MockNamedValue::getObjectPointer((MockNamedValue *)(local_d8 + 0x30));
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,pvVar1,pvVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x87,pTVar5);
  MockNamedValue::~MockNamedValue((MockNamedValue *)(local_d8 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_d8 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_d8 + 0x20));
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_148,"data");
  MockSupport::getData(&local_128,pMVar2,&local_148);
  MockNamedValue::getType((MockNamedValue *)local_d8);
  pcVar6 = SimpleString::asCharString((SimpleString *)local_d8);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"type",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x88,pTVar5);
  SimpleString::~SimpleString((SimpleString *)local_d8);
  MockNamedValue::~MockNamedValue(&local_128);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  return;
}

Assistant:

TEST(MockSupportTest, setDataObject)
{
    void * ptr = (void*) 0x001;
    mock().setDataObject("data", "type", ptr);
    POINTERS_EQUAL(ptr, mock().getData("data").getObjectPointer());
    STRCMP_EQUAL("type", mock().getData("data").getType().asCharString());
}